

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMTypeRef CompileLlvmType(LlvmCompilationContext *ctx,TypeBase *type)

{
  InplaceStr *pIVar1;
  LLVMContextRef pLVar2;
  bool bVar3;
  LLVMTypeRefOpaque **ppLVar4;
  TypeRef *pTVar5;
  LLVMTypeRef pLVar6;
  TypeArray *pTVar7;
  TypeUnsizedArray *pTVar8;
  TypeClass *pTVar9;
  char *pcVar10;
  TypeBase *local_260;
  LLVMTypeRef local_1d8;
  MemberHandle *local_1d0;
  MemberHandle *curr;
  SmallArray<LLVMTypeRefOpaque_*,_32U> members_4;
  TypeClass *typeClass;
  LLVMTypeRef members_3 [2];
  LLVMTypeRef members_2 [2];
  TypeUnsizedArray *typeUnsizedArray;
  TypeArray *typeArray;
  TypeRef *typeRef;
  LLVMTypeRef members_1 [3];
  LLVMTypeRef local_38;
  LLVMTypeRef members [2];
  LLVMTypeRef llvmType;
  TypeBase *type_local;
  LlvmCompilationContext *ctx_local;
  
  ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[](&ctx->types,type->typeIndex);
  members[1] = *ppLVar4;
  ctx_local = (LlvmCompilationContext *)members[1];
  if ((LlvmCompilationContext *)members[1] == (LlvmCompilationContext *)0x0) {
    bVar3 = isType<TypeVoid>(type);
    if (bVar3) {
      pLVar6 = LLVMVoidTypeInContext(ctx->context);
      ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[](&ctx->types,type->typeIndex);
      *ppLVar4 = pLVar6;
    }
    else {
      bVar3 = isType<TypeBool>(type);
      if (bVar3) {
        pLVar6 = LLVMInt1TypeInContext(ctx->context);
        ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[](&ctx->types,type->typeIndex);
        *ppLVar4 = pLVar6;
      }
      else {
        bVar3 = isType<TypeChar>(type);
        if (bVar3) {
          pLVar6 = LLVMInt8TypeInContext(ctx->context);
          ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[](&ctx->types,type->typeIndex);
          *ppLVar4 = pLVar6;
        }
        else {
          bVar3 = isType<TypeShort>(type);
          if (bVar3) {
            pLVar6 = LLVMInt16TypeInContext(ctx->context);
            ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[](&ctx->types,type->typeIndex)
            ;
            *ppLVar4 = pLVar6;
          }
          else {
            bVar3 = isType<TypeInt>(type);
            if (bVar3) {
              pLVar6 = LLVMInt32TypeInContext(ctx->context);
              ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                  (&ctx->types,type->typeIndex);
              *ppLVar4 = pLVar6;
            }
            else {
              bVar3 = isType<TypeLong>(type);
              if (bVar3) {
                pLVar6 = LLVMInt64TypeInContext(ctx->context);
                ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                    (&ctx->types,type->typeIndex);
                *ppLVar4 = pLVar6;
              }
              else {
                bVar3 = isType<TypeFloat>(type);
                if (bVar3) {
                  pLVar6 = LLVMFloatTypeInContext(ctx->context);
                  ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                      (&ctx->types,type->typeIndex);
                  *ppLVar4 = pLVar6;
                }
                else {
                  bVar3 = isType<TypeDouble>(type);
                  if (bVar3) {
                    pLVar6 = LLVMDoubleTypeInContext(ctx->context);
                    ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                        (&ctx->types,type->typeIndex);
                    *ppLVar4 = pLVar6;
                  }
                  else {
                    bVar3 = isType<TypeTypeID>(type);
                    if (bVar3) {
                      pLVar6 = LLVMInt32TypeInContext(ctx->context);
                      ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                          (&ctx->types,type->typeIndex);
                      *ppLVar4 = pLVar6;
                    }
                    else {
                      bVar3 = isType<TypeFunctionID>(type);
                      if (bVar3) {
                        pLVar6 = LLVMInt32TypeInContext(ctx->context);
                        ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                            (&ctx->types,type->typeIndex);
                        *ppLVar4 = pLVar6;
                      }
                      else {
                        bVar3 = isType<TypeNullptr>(type);
                        if (bVar3) {
                          pLVar6 = CompileLlvmType(ctx,ctx->ctx->typeChar);
                          pLVar6 = LLVMPointerType(pLVar6,0);
                          ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                              (&ctx->types,type->typeIndex);
                          *ppLVar4 = pLVar6;
                        }
                        else {
                          bVar3 = isType<TypeAutoRef>(type);
                          if (bVar3) {
                            local_38 = LLVMInt32TypeInContext(ctx->context);
                            pLVar6 = CompileLlvmType(ctx,ctx->ctx->typeChar);
                            members[0] = LLVMPointerType(pLVar6,0);
                            pLVar6 = LLVMStructTypeInContext(ctx->context,&local_38,2,true);
                            ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                                (&ctx->types,type->typeIndex);
                            *ppLVar4 = pLVar6;
                          }
                          else {
                            bVar3 = isType<TypeAutoArray>(type);
                            if (bVar3) {
                              typeRef = (TypeRef *)LLVMInt32TypeInContext(ctx->context);
                              pLVar6 = CompileLlvmType(ctx,ctx->ctx->typeChar);
                              members_1[0] = LLVMPointerType(pLVar6,0);
                              members_1[1] = LLVMInt32TypeInContext(ctx->context);
                              pLVar6 = LLVMStructTypeInContext
                                                 (ctx->context,(LLVMTypeRef *)&typeRef,3,true);
                              ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                                  (&ctx->types,type->typeIndex);
                              *ppLVar4 = pLVar6;
                            }
                            else {
                              pTVar5 = getType<TypeRef>(type);
                              if (pTVar5 == (TypeRef *)0x0) {
                                pTVar7 = getType<TypeArray>(type);
                                if (pTVar7 == (TypeArray *)0x0) {
                                  pTVar8 = getType<TypeUnsizedArray>(type);
                                  if (pTVar8 == (TypeUnsizedArray *)0x0) {
                                    bVar3 = isType<TypeFunction>(type);
                                    if (bVar3) {
                                      typeClass = (TypeClass *)
                                                  CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
                                      members_3[0] = CompileLlvmType(ctx,ctx->ctx->typeNullPtr);
                                      pLVar6 = LLVMStructTypeInContext
                                                         (ctx->context,(LLVMTypeRef *)&typeClass,2,
                                                          true);
                                      ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                                          (&ctx->types,type->typeIndex);
                                      *ppLVar4 = pLVar6;
                                    }
                                    else {
                                      pTVar9 = getType<TypeClass>(type);
                                      if (pTVar9 == (TypeClass *)0x0) {
                                        bVar3 = isType<TypeEnum>(type);
                                        if (!bVar3) {
                                          __assert_fail("!\"unknown type\"",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                                                  ,0x1ba,
                                                  "LLVMTypeRef CompileLlvmType(LlvmCompilationContext &, TypeBase *)"
                                                  );
                                        }
                                        pLVar6 = LLVMInt32TypeInContext(ctx->context);
                                        ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                                            (&ctx->types,type->typeIndex);
                                        *ppLVar4 = pLVar6;
                                      }
                                      else {
                                        pLVar2 = ctx->context;
                                        pIVar1 = &(pTVar9->super_TypeStruct).super_TypeBase.name;
                                        members_4.allocator = (Allocator *)pIVar1->begin;
                                        pcVar10 = CreateLlvmName(ctx,*pIVar1);
                                        pLVar6 = LLVMStructCreateNamed(pLVar2,pcVar10);
                                        ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                                            (&ctx->types,type->typeIndex);
                                        *ppLVar4 = pLVar6;
                                        SmallArray<LLVMTypeRefOpaque_*,_32U>::SmallArray
                                                  ((SmallArray<LLVMTypeRefOpaque_*,_32U> *)&curr,
                                                   ctx->allocator);
                                        for (local_1d0 = (pTVar9->super_TypeStruct).members.head;
                                            local_1d0 != (MemberHandle *)0x0;
                                            local_1d0 = local_1d0->next) {
                                          local_1d8 = CompileLlvmType(ctx,local_1d0->variable->type)
                                          ;
                                          SmallArray<LLVMTypeRefOpaque_*,_32U>::push_back
                                                    ((SmallArray<LLVMTypeRefOpaque_*,_32U> *)&curr,
                                                     &local_1d8);
                                        }
                                        ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                                            (&ctx->types,type->typeIndex);
                                        LLVMStructSetBody(*ppLVar4,(LLVMTypeRef *)curr,
                                                          (uint)members_4.data,false);
                                        SmallArray<LLVMTypeRefOpaque_*,_32U>::~SmallArray
                                                  ((SmallArray<LLVMTypeRefOpaque_*,_32U> *)&curr);
                                      }
                                    }
                                  }
                                  else {
                                    pLVar6 = CompileLlvmType(ctx,pTVar8->subType);
                                    members_3[1] = LLVMPointerType(pLVar6,0);
                                    LLVMInt32TypeInContext(ctx->context);
                                    pLVar6 = LLVMStructTypeInContext
                                                       (ctx->context,members_3 + 1,2,true);
                                    ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                                        (&ctx->types,type->typeIndex);
                                    *ppLVar4 = pLVar6;
                                  }
                                }
                                else if (pTVar7->subType == ctx->ctx->typeChar) {
                                  pLVar6 = CompileLlvmType(ctx,pTVar7->subType);
                                  pLVar6 = LLVMArrayType(pLVar6,(int)pTVar7->length + 3U &
                                                                0xfffffffc);
                                  ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                                      (&ctx->types,type->typeIndex);
                                  *ppLVar4 = pLVar6;
                                }
                                else {
                                  pLVar6 = CompileLlvmType(ctx,pTVar7->subType);
                                  pLVar6 = LLVMArrayType(pLVar6,(uint)pTVar7->length);
                                  ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                                      (&ctx->types,type->typeIndex);
                                  *ppLVar4 = pLVar6;
                                }
                              }
                              else {
                                if (pTVar5->subType == ctx->ctx->typeVoid) {
                                  local_260 = ctx->ctx->typeChar;
                                }
                                else {
                                  local_260 = pTVar5->subType;
                                }
                                pLVar6 = CompileLlvmType(ctx,local_260);
                                pLVar6 = LLVMPointerType(pLVar6,0);
                                ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[]
                                                    (&ctx->types,type->typeIndex);
                                *ppLVar4 = pLVar6;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    ppLVar4 = SmallArray<LLVMTypeRefOpaque_*,_128U>::operator[](&ctx->types,type->typeIndex);
    ctx_local = (LlvmCompilationContext *)*ppLVar4;
  }
  return (LLVMTypeRef)ctx_local;
}

Assistant:

LLVMTypeRef CompileLlvmType(LlvmCompilationContext &ctx, TypeBase *type)
{
	if(LLVMTypeRef llvmType = ctx.types[type->typeIndex])
		return llvmType;

	if(isType<TypeVoid>(type))
	{
		ctx.types[type->typeIndex] = LLVMVoidTypeInContext(ctx.context);
	}
	else if(isType<TypeBool>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt1TypeInContext(ctx.context);
	}
	else if(isType<TypeChar>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt8TypeInContext(ctx.context);
	}
	else if(isType<TypeShort>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt16TypeInContext(ctx.context);
	}
	else if(isType<TypeInt>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else if(isType<TypeLong>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt64TypeInContext(ctx.context);
	}
	else if(isType<TypeFloat>(type))
	{
		ctx.types[type->typeIndex] = LLVMFloatTypeInContext(ctx.context);
	}
	else if(isType<TypeDouble>(type))
	{
		ctx.types[type->typeIndex] = LLVMDoubleTypeInContext(ctx.context);
	}
	else if(isType<TypeTypeID>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else if(isType<TypeFunctionID>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else if(isType<TypeNullptr>(type))
	{
		ctx.types[type->typeIndex] = LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0);
	}
	else if(isType<TypeAutoRef>(type))
	{
		LLVMTypeRef members[2] = { LLVMInt32TypeInContext(ctx.context), LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 2, true);
	}
	else if(isType<TypeAutoArray>(type))
	{
		LLVMTypeRef members[3] = { LLVMInt32TypeInContext(ctx.context), LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0), LLVMInt32TypeInContext(ctx.context) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 3, true);
	}
	else if(TypeRef *typeRef = getType<TypeRef>(type))
	{
		ctx.types[type->typeIndex] = LLVMPointerType(CompileLlvmType(ctx, typeRef->subType == ctx.ctx.typeVoid ? ctx.ctx.typeChar : typeRef->subType), 0);
	}
	else if(TypeArray *typeArray = getType<TypeArray>(type))
	{
		if(typeArray->subType == ctx.ctx.typeChar)
			ctx.types[type->typeIndex] = LLVMArrayType(CompileLlvmType(ctx, typeArray->subType), ((unsigned)typeArray->length + 3u) & ~3u);
		else
			ctx.types[type->typeIndex] = LLVMArrayType(CompileLlvmType(ctx, typeArray->subType), (unsigned)typeArray->length);
	}
	else if(TypeUnsizedArray *typeUnsizedArray = getType<TypeUnsizedArray>(type))
	{
		LLVMTypeRef members[2] = { LLVMPointerType(CompileLlvmType(ctx, typeUnsizedArray->subType), 0), LLVMInt32TypeInContext(ctx.context) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 2, true);
	}
	else if(isType<TypeFunction>(type))
	{
		// TODO: use function indices and remap before execution
		//LLVMTypeRef members[2] = { LLVMPointerType(CompileLlvmType(ctx, ctx.ctx.typeChar), 0), LLVMInt32TypeInContext(ctx.context) };
		LLVMTypeRef members[2] = { CompileLlvmType(ctx, ctx.ctx.typeNullPtr), CompileLlvmType(ctx, ctx.ctx.typeNullPtr) };

		ctx.types[type->typeIndex] = LLVMStructTypeInContext(ctx.context, members, 2, true);
	}
	else if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		ctx.types[type->typeIndex] = LLVMStructCreateNamed(ctx.context, CreateLlvmName(ctx, typeClass->name));

		SmallArray<LLVMTypeRef, 32> members(ctx.allocator);

		for(MemberHandle *curr = typeClass->members.head; curr; curr = curr->next)
			members.push_back(CompileLlvmType(ctx, curr->variable->type));

		// TODO: create packed type with custom padding
		LLVMStructSetBody(ctx.types[type->typeIndex], members.data, members.count, false);
	}
	else if(isType<TypeEnum>(type))
	{
		ctx.types[type->typeIndex] = LLVMInt32TypeInContext(ctx.context);
	}
	else
	{
		assert(!"unknown type");
	}

	return ctx.types[type->typeIndex];
}